

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiple_load_store.c
# Opt level: O3

void multiple_load_store(arm7tdmi_t *state,thumbinstr_t *thminstr)

{
  ushort uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t *puVar4;
  uint uVar5;
  access_type_t aVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  int i;
  ulong uVar9;
  uint32_t *puVar10;
  undefined8 local_38;
  
  uVar1 = thminstr->raw;
  uVar5 = uVar1 >> 8 & 7;
  uVar3 = state->r[uVar5];
  if ((uVar1 & 0xff) == 0) {
    if ((uVar1 >> 0xb & 1) == 0) {
      (*state->write_word)(uVar3,state->pc + 2,ACCESS_NONSEQUENTIAL);
    }
    else {
      uVar7 = (*state->read_word)(uVar3,ACCESS_NONSEQUENTIAL);
      uVar5 = uVar7 | 1;
      if (2 < gba_log_verbosity) {
        printf("[DEBUG] Set r%d to 0x%08X\n",0xf,(ulong)uVar5);
      }
      if (((uint)state->cpsr & 0x20) == 0) {
        uVar5 = uVar7 & 0xfffffffe;
      }
      set_pc(state,uVar5);
    }
    uVar7 = uVar3 + 0x40;
  }
  else {
    uVar7 = uVar3;
    if ((uVar1 >> 0xb & 1) == 0) {
      aVar6 = ACCESS_NONSEQUENTIAL;
      bVar2 = true;
      uVar9 = 0;
      do {
        uVar5 = thminstr->raw & 0xff;
        if ((uVar5 >> ((uint)uVar9 & 0x1f) & 1) != 0) {
          if (uVar9 == (thminstr->raw >> 8 & 7)) {
            uVar8 = uVar3;
            if (!bVar2) {
              uVar8 = uVar3 + ((uVar5 * 0x8040201 >> 3 & 0x11111111) * 0x11111111 >> 0x1c) * 4;
            }
          }
          else {
            uVar8 = state->r[uVar9];
          }
          (*state->write_word)(uVar7,uVar8,aVar6);
          uVar7 = uVar7 + 4;
          aVar6 = ACCESS_SEQUENTIAL;
          bVar2 = false;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != 8);
    }
    else {
      local_38 = (ulong)CONCAT24(uVar1,1 << (sbyte)uVar5) & 0xffffffffff;
      puVar10 = state->r + 5;
      aVar6 = ACCESS_NONSEQUENTIAL;
      uVar9 = 0;
      do {
        if ((*(byte *)thminstr & (byte)(1 << ((byte)uVar9 & 0x1f))) != 0) {
          uVar3 = (*state->read_word)(uVar7,aVar6);
          if (2 < gba_log_verbosity) {
            printf("[DEBUG] Set r%d to 0x%08X\n",uVar9 & 0xffffffff,(ulong)uVar3);
          }
          puVar4 = puVar10 + -5;
          if (((state->cpsr).raw & 0x1f) == 0x11) {
            puVar4 = puVar10;
          }
          if (4 < uVar9 - 8) {
            puVar4 = puVar10 + -5;
          }
          *puVar4 = uVar3;
          uVar7 = uVar7 + 4;
          aVar6 = ACCESS_SEQUENTIAL;
        }
        uVar9 = uVar9 + 1;
        puVar10 = puVar10 + 1;
      } while (uVar9 != 9);
      if ((local_38._4_4_ & (uint)local_38) != 0) {
        return;
      }
    }
  }
  uVar9 = (ulong)(*(byte *)((long)thminstr + 1) & 7);
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",uVar9,(ulong)uVar7);
  }
  state->r[uVar9] = uVar7;
  return;
}

Assistant:

void multiple_load_store(arm7tdmi_t* state, thumbinstr_t* thminstr) {
    multiple_load_store_t* instr = &thminstr->MULTIPLE_LOAD_STORE;
    word address = get_register(state, instr->rb);
    word base = address;
    bool writeback = true;
    access_type_t access = ACCESS_NONSEQUENTIAL;
    if (instr->rlist == 0) { // When rlist 0, save and load the program counter instead
        if (instr->l) {
            set_register(state, REG_PC, state->read_word(address, ACCESS_NONSEQUENTIAL) | 1);
        } else {
            state->write_word(address, state->pc + 2, ACCESS_NONSEQUENTIAL);
        }
        address += 0x40;
    }
    else if (instr->l) {
        if (instr->rlist & (1 << instr->rb)) {
            writeback = false; // Don't writeback to rb when we're also transferring to rb
        }
        for (int i = 0; i <= 8; i++) {
            if ((instr->rlist >> i) & 1) {
                set_register(state, i, state->read_word(address, access));
                access = ACCESS_SEQUENTIAL;
                address += 4;
            }
        }
    } else {
        bool first = true;
        for (int i = 0; i < 8; i++) {
            if ((instr->rlist >> i) & 1) {
                word value;
                if (i == instr->rb) {
                    if (first) {
                        value = base;
                    } else {
                        value = base + 4 * popcount(instr->rlist);
                    }
                } else {
                    value = get_register(state, i);
                }

                state->write_word(address, value, access);
                access = ACCESS_SEQUENTIAL;
                first = false;
                address += 4;
            }
        }
    }

    if (writeback) {
        set_register(state, instr->rb, address);
    }
}